

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

int __thiscall
QTextDocument::clone(QTextDocument *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  qreal qVar1;
  bool bVar2;
  QTextDocumentPrivate *pQVar3;
  void *pvVar4;
  QTextDocumentPrivate *this_00;
  QTextDocumentPrivate *pQVar5;
  long in_FS_OFFSET;
  QTextDocumentPrivate *priv;
  QTextDocument *doc;
  QTextDocumentPrivate *d;
  QTextCursor thisCursor;
  QTextCharFormat blockCharFormat;
  QTextBlockFormat blockFormat;
  QTextDocumentPrivate *in_stack_ffffffffffffff28;
  QTextDocument *in_stack_ffffffffffffff30;
  QObject *in_stack_ffffffffffffff38;
  function<QVariant_(const_QUrl_&)> *this_01;
  QTextOption *in_stack_ffffffffffffff40;
  QTextOption *in_stack_ffffffffffffff48;
  function<QVariant_(const_QUrl_&)> local_38;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QTextDocument *)0x7aa7e5);
  pvVar4 = operator_new(0x10);
  QTextDocument((QTextDocument *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  bVar2 = isEmpty(in_stack_ffffffffffffff30);
  if (bVar2) {
    QTextCursor::QTextCursor
              ((QTextCursor *)in_stack_ffffffffffffff40,(QTextDocument *)in_stack_ffffffffffffff38);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::blockFormat((QTextCursor *)in_stack_ffffffffffffff40);
    bVar2 = QTextBlockFormat::isValid((QTextBlockFormat *)0x7aa884);
    if ((bVar2) && (bVar2 = QTextFormat::isEmpty((QTextFormat *)0x7aa897), !bVar2)) {
      QTextCursor::QTextCursor
                ((QTextCursor *)in_stack_ffffffffffffff40,(QTextDocument *)in_stack_ffffffffffffff38
                );
      QTextCursor::setBlockFormat
                ((QTextCursor *)in_stack_ffffffffffffff30,
                 (QTextBlockFormat *)in_stack_ffffffffffffff28);
      QTextCursor::~QTextCursor((QTextCursor *)0x7aa8cf);
    }
    local_38.super__Function_base._M_manager = (_Manager_type)&DAT_aaaaaaaaaaaaaaaa;
    local_38._M_invoker = (_Invoker_type)&DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::blockCharFormat((QTextCursor *)in_stack_ffffffffffffff40);
    bVar2 = QTextCharFormat::isValid((QTextCharFormat *)0x7aa90f);
    if ((bVar2) && (bVar2 = QTextFormat::isEmpty((QTextFormat *)0x7aa922), !bVar2)) {
      QTextCursor::QTextCursor
                ((QTextCursor *)in_stack_ffffffffffffff40,(QTextDocument *)in_stack_ffffffffffffff38
                );
      QTextCursor::setBlockCharFormat
                ((QTextCursor *)in_stack_ffffffffffffff30,
                 (QTextCharFormat *)in_stack_ffffffffffffff28);
      QTextCursor::~QTextCursor((QTextCursor *)0x7aa951);
    }
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7aa95e);
    QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7aa96b);
    QTextCursor::~QTextCursor((QTextCursor *)0x7aa978);
  }
  else {
    QTextCursor::QTextCursor
              ((QTextCursor *)in_stack_ffffffffffffff40,(QTextDocument *)in_stack_ffffffffffffff38);
    QTextDocumentFragment::QTextDocumentFragment
              ((QTextDocumentFragment *)in_stack_ffffffffffffff40,
               (QTextDocument *)in_stack_ffffffffffffff38);
    QTextCursor::insertFragment
              ((QTextCursor *)in_stack_ffffffffffffff40,
               (QTextDocumentFragment *)in_stack_ffffffffffffff38);
    QTextDocumentFragment::~QTextDocumentFragment
              ((QTextDocumentFragment *)in_stack_ffffffffffffff30);
    QTextCursor::~QTextCursor((QTextCursor *)0x7aa9bb);
  }
  this_00 = (QTextDocumentPrivate *)rootFrame(in_stack_ffffffffffffff30);
  rootFrame((QTextDocument *)this_00);
  this_01 = &local_38;
  QTextFrame::frameFormat((QTextFrame *)in_stack_ffffffffffffff40);
  QTextFrame::setFrameFormat((QTextFrame *)this_00,(QTextFrameFormat *)in_stack_ffffffffffffff28);
  QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x7aaa02);
  pQVar5 = d_func((QTextDocument *)0x7aaa0c);
  QString::operator=(&pQVar5->title,(QString *)&pQVar3->title);
  QString::operator=(&pQVar5->url,(QString *)&pQVar3->url);
  QString::operator=(&pQVar5->cssMedia,(QString *)&pQVar3->cssMedia);
  qVar1 = (pQVar3->pageSize).ht;
  (pQVar5->pageSize).wd = (pQVar3->pageSize).wd;
  (pQVar5->pageSize).ht = qVar1;
  pQVar5->indentWidth = pQVar3->indentWidth;
  QTextOption::operator=(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  QTextDocumentPrivate::defaultFont(in_stack_ffffffffffffff28);
  QTextDocumentPrivate::setDefaultFont(this_00,(QFont *)in_stack_ffffffffffffff28);
  QFont::~QFont((QFont *)0x7aaaf1);
  QMap<QUrl,_QVariant>::operator=
            ((QMap<QUrl,_QVariant> *)this_00,(QMap<QUrl,_QVariant> *)in_stack_ffffffffffffff28);
  QMap<QUrl,_QVariant>::clear((QMap<QUrl,_QVariant> *)this_00);
  std::function<QVariant_(const_QUrl_&)>::operator=
            (this_01,(function<QVariant_(const_QUrl_&)> *)this_00);
  QString::operator=(&pQVar5->defaultStyleSheet,(QString *)&pQVar3->defaultStyleSheet);
  QCss::StyleSheet::operator=((StyleSheet *)this_00,(StyleSheet *)in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)pvVar4;
}

Assistant:

QTextDocument *QTextDocument::clone(QObject *parent) const
{
    Q_D(const QTextDocument);
    QTextDocument *doc = new QTextDocument(parent);
    if (isEmpty()) {
        const QTextCursor thisCursor(const_cast<QTextDocument *>(this));

        const auto blockFormat = thisCursor.blockFormat();
        if (blockFormat.isValid() && !blockFormat.isEmpty())
            QTextCursor(doc).setBlockFormat(blockFormat);

        const auto blockCharFormat = thisCursor.blockCharFormat();
        if (blockCharFormat.isValid() && !blockCharFormat.isEmpty())
            QTextCursor(doc).setBlockCharFormat(blockCharFormat);
    } else {
        QTextCursor(doc).insertFragment(QTextDocumentFragment(this));
    }
    doc->rootFrame()->setFrameFormat(rootFrame()->frameFormat());
    QTextDocumentPrivate *priv = doc->d_func();
    priv->title = d->title;
    priv->url = d->url;
    priv->cssMedia = d->cssMedia;
    priv->pageSize = d->pageSize;
    priv->indentWidth = d->indentWidth;
    priv->defaultTextOption = d->defaultTextOption;
    priv->setDefaultFont(d->defaultFont());
    priv->resources = d->resources;
    priv->cachedResources.clear();
    priv->resourceProvider = d->resourceProvider;
#ifndef QT_NO_CSSPARSER
    priv->defaultStyleSheet = d->defaultStyleSheet;
    priv->parsedDefaultStyleSheet = d->parsedDefaultStyleSheet;
#endif
    return doc;
}